

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O0

void __thiscall
amrex::FluxRegister::FineSetVal
          (FluxRegister *this,int dir,int boxno,int destcomp,int numcomp,Real val,RunOn runon)

{
  bool bVar1;
  long lVar2;
  int in_ESI;
  long in_RDI;
  int in_R9D;
  FArrayBox *hireg;
  FArrayBox *loreg;
  int in_stack_ffffffffffffff6c;
  FabSet *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff88;
  BaseFab<double> *in_stack_ffffffffffffff90;
  BaseFab<double> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Orientation local_44;
  BaseFab<double> *local_40;
  Orientation local_34;
  BaseFab<double> *local_30;
  int local_24;
  int local_c;
  
  local_24 = in_R9D;
  local_c = in_ESI;
  Orientation::Orientation(&local_34,in_ESI,low);
  Orientation::operator_cast_to_int(&local_34);
  local_30 = &FabSet::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c)->
              super_BaseFab<double>;
  if ((local_24 == 0) &&
     (in_stack_ffffffffffffffa7 = Gpu::inLaunchRegion(), (bool)in_stack_ffffffffffffffa7)) {
    in_stack_ffffffffffffff98 = local_30;
    BaseFab<double>::box(local_30);
    BaseFab<double>::setVal<(amrex::RunOn)0>
              ((BaseFab<double> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (double *)in_stack_ffffffffffffff98,(Box *)in_stack_ffffffffffffff90,
               (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  }
  else {
    in_stack_ffffffffffffff90 = local_30;
    BaseFab<double>::box(local_30);
    BaseFab<double>::setVal<(amrex::RunOn)1>
              ((BaseFab<double> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (double *)in_stack_ffffffffffffff98,(Box *)in_stack_ffffffffffffff90,
               (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  }
  lVar2 = in_RDI + 8;
  Orientation::Orientation(&local_44,local_c,high);
  Orientation::operator_cast_to_int(&local_44);
  local_40 = &FabSet::operator[](in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c)->
              super_BaseFab<double>;
  if ((local_24 == 0) && (bVar1 = Gpu::inLaunchRegion(), bVar1)) {
    BaseFab<double>::box(local_40);
    BaseFab<double>::setVal<(amrex::RunOn)0>
              ((BaseFab<double> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (double *)in_stack_ffffffffffffff98,(Box *)in_stack_ffffffffffffff90,
               (int)((ulong)lVar2 >> 0x20),(int)lVar2);
  }
  else {
    BaseFab<double>::box(local_40);
    BaseFab<double>::setVal<(amrex::RunOn)1>
              ((BaseFab<double> *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (double *)in_stack_ffffffffffffff98,(Box *)in_stack_ffffffffffffff90,
               (int)((ulong)lVar2 >> 0x20),(int)lVar2);
  }
  return;
}

Assistant:

void
FluxRegister::FineSetVal (int              dir,
                          int              boxno,
                          int              destcomp,
                          int              numcomp,
                          Real             val,
                          RunOn            runon) noexcept
{
    BL_ASSERT(destcomp >= 0 && destcomp+numcomp <= ncomp);

    FArrayBox& loreg = bndry[Orientation(dir,Orientation::low)][boxno];
    BL_ASSERT(numcomp <= loreg.nComp());
    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion()) {
        loreg.setVal<RunOn::Device>(val, loreg.box(), destcomp, numcomp);
    } else {
        loreg.setVal<RunOn::Host>(val, loreg.box(), destcomp, numcomp);
    }

    FArrayBox& hireg = bndry[Orientation(dir,Orientation::high)][boxno];
    BL_ASSERT(numcomp <= hireg.nComp());
    if ((runon == RunOn::Gpu) && Gpu::inLaunchRegion()) {
        hireg.setVal<RunOn::Device>(val, hireg.box(), destcomp, numcomp);
    } else {
        hireg.setVal<RunOn::Host>(val, hireg.box(), destcomp, numcomp);
    }
}